

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

Curl_hash_element * Curl_hash_next_element(Curl_hash_iterator *iter)

{
  int iVar1;
  int iVar2;
  Curl_llist *pCVar3;
  long lVar4;
  Curl_llist_element *pCVar5;
  
  pCVar3 = iter->hash->table;
  if (pCVar3 != (Curl_llist *)0x0) {
    if (iter->current_element != (Curl_llist_element *)0x0) {
      pCVar5 = iter->current_element->next;
      iter->current_element = pCVar5;
      if (pCVar5 != (Curl_llist_element *)0x0) {
LAB_005fd01a:
        return (Curl_hash_element *)pCVar5->ptr;
      }
    }
    iVar1 = iter->slot_index;
    iVar2 = iter->hash->slots;
    if (iVar1 < iVar2) {
      pCVar3 = pCVar3 + iVar1;
      lVar4 = 0;
      do {
        pCVar5 = pCVar3->head;
        if (pCVar5 != (Curl_llist_element *)0x0) {
          iter->current_element = pCVar5;
          iter->slot_index = (iVar1 - (int)lVar4) + 1;
          goto LAB_005fd01a;
        }
        lVar4 = lVar4 + -1;
        pCVar3 = pCVar3 + 1;
      } while ((long)iVar1 - (long)iVar2 != lVar4);
    }
    iter->current_element = (Curl_llist_element *)0x0;
  }
  return (Curl_hash_element *)0x0;
}

Assistant:

struct Curl_hash_element *
Curl_hash_next_element(struct Curl_hash_iterator *iter)
{
  struct Curl_hash *h = iter->hash;

  if(!h->table)
    return NULL; /* empty hash, nothing to return */

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    int i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(h->table[i].head) {
        iter->current_element = h->table[i].head;
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct Curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  iter->current_element = NULL;
  return NULL;
}